

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O3

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  SQRESULT SVar4;
  long lVar5;
  SQChar *pSVar6;
  long lVar7;
  long lVar8;
  longlong lVar9;
  size_t sVar10;
  undefined1 auVar11 [8];
  long lVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  HSQUIRRELVM pSVar17;
  SQInteger ti;
  SQFloat tf;
  SQChar *ts;
  SQChar fmt [20];
  SQChar *format;
  char *local_b0;
  long local_a8;
  size_t local_a0;
  HSQUIRRELVM local_98;
  float local_8c;
  long local_88;
  undefined1 local_80 [8];
  char local_78;
  undefined1 local_77 [31];
  long local_58;
  SQInteger *local_50;
  SQChar **local_48;
  long local_40;
  long local_38;
  
  SVar4 = sq_getstring(v,nformatstringidx,&local_58);
  if (-1 < SVar4) {
    local_50 = outlen;
    local_48 = output;
    lVar5 = sq_getsize(v,nformatstringidx);
    local_98 = v;
    pSVar6 = (SQChar *)sq_getscratchpad(v,lVar5 + 2U);
    if (0 < lVar5) {
      lVar12 = nformatstringidx + 1;
      lVar15 = 0;
      lVar16 = 0;
      local_a8 = 0;
      local_a0 = lVar5 + 2U;
      local_38 = lVar5;
LAB_00109817:
      pSVar17 = local_98;
      if (*(char *)(local_58 + lVar16) == '%') {
        if (*(char *)(local_58 + 1 + lVar16) == '%') {
          pSVar6[lVar15] = '%';
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + 2;
          goto LAB_00109b17;
        }
        lVar7 = sq_gettop(local_98);
        lVar5 = local_58;
        if (lVar7 < lVar12) {
          pcVar14 = "not enough parameters for the given format string";
          goto LAB_00109bc1;
        }
        lVar7 = lVar16 + 1;
        local_78 = '%';
        pcVar14 = (char *)(lVar16 + local_58 + 2);
        lVar16 = lVar16 + 2;
        lVar13 = lVar7;
        while (((ulong)*(byte *)(local_58 + lVar13) < 0x31 &&
               ((0x1280900000000U >> ((ulong)*(byte *)(local_58 + lVar13) & 0x3f) & 1) != 0))) {
          lVar13 = lVar13 + 1;
          lVar16 = lVar16 + 1;
          pcVar14 = pcVar14 + 1;
        }
        lVar8 = 0;
        do {
          local_88 = lVar12;
          if (9 < (int)*(char *)(local_58 + lVar13) - 0x30U) {
            *(undefined1 *)((long)&local_b0 + lVar8) = 0;
            if (lVar8 == 0) {
              local_a8 = 0;
            }
            else {
              local_40 = lVar7;
              local_a8 = strtoll((char *)&local_b0,(char **)local_80,10);
              lVar7 = local_40;
            }
            lVar12 = local_88;
            pSVar17 = local_98;
            if (*(char *)(lVar5 + lVar13) != '.') goto LAB_00109987;
            lVar8 = 0;
            goto LAB_00109920;
          }
          *(char *)((long)&local_b0 + lVar8) = *(char *)(local_58 + lVar13);
          lVar13 = lVar13 + 1;
          lVar8 = lVar8 + 1;
          lVar16 = lVar16 + 1;
          pcVar14 = pcVar14 + 1;
        } while (lVar8 != 3);
        pcVar14 = "width format too long";
LAB_001099a5:
        pSVar17 = local_98;
        lVar13 = sq_throwerror(local_98,pcVar14);
        lVar12 = local_88;
        goto LAB_001099d5;
      }
      pSVar6[lVar15] = *(char *)(local_58 + lVar16);
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 1;
      goto LAB_00109b17;
    }
    lVar15 = 0;
LAB_00109b76:
    *local_50 = lVar15;
    pSVar6[lVar15] = '\0';
    *local_48 = pSVar6;
    SVar4 = 0;
  }
  return SVar4;
LAB_00109920:
  if ((int)*pcVar14 - 0x30U < 10) goto code_r0x0010992d;
  *(undefined1 *)((long)&local_b0 + lVar8) = 0;
  lVar13 = lVar16;
  if (lVar8 != 0) {
    lVar9 = strtoll((char *)&local_b0,(char **)local_80,10);
    local_a8 = local_a8 + lVar9;
  }
LAB_00109987:
  pSVar17 = local_98;
  lVar12 = lVar13 - lVar7;
  if (0x14 < lVar12) {
    pcVar14 = "format too long";
    goto LAB_001099a5;
  }
  memcpy(local_77,(void *)(lVar5 + lVar7),lVar12 + 1);
  local_77[lVar12 + 1] = 0;
  lVar12 = local_88;
  goto LAB_001099d5;
code_r0x0010992d:
  *(char *)((long)&local_b0 + lVar8) = *pcVar14;
  lVar8 = lVar8 + 1;
  lVar16 = lVar16 + 1;
  pcVar14 = pcVar14 + 1;
  if (lVar8 == 3) goto code_r0x00109940;
  goto LAB_00109920;
code_r0x00109940:
  lVar13 = sq_throwerror(local_98,"precision format too long");
LAB_001099d5:
  if (lVar13 < 0) {
    return -1;
  }
  local_80 = (undefined1  [8])0x0;
  local_b0 = (char *)0x0;
  local_8c = 0.0;
  bVar1 = *(byte *)(local_58 + lVar13);
  if (bVar1 < 99) {
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) {
switchD_00109a1f_caseD_65:
      lVar5 = sq_getfloat(pSVar17,lVar12,&local_8c);
      if (-1 < lVar5) {
        sVar10 = local_a0 + local_a8 + 0x66;
        pSVar6 = (SQChar *)sq_getscratchpad(pSVar17,sVar10);
        local_a0 = sVar10;
        iVar3 = snprintf(pSVar6 + lVar15,sVar10,&local_78,(double)local_8c);
        goto LAB_00109b04;
      }
      pcVar14 = "float expected for the specified format";
      goto LAB_00109bc1;
    }
    if (bVar1 != 0x58) goto switchD_00109a1f_caseD_68;
switchD_00109a1f_caseD_64:
    sVar10 = strlen(&local_78);
    uVar2 = local_80[sVar10 + 7];
    *(undefined2 *)(local_80 + sVar10 + 7) = 0x6c6c;
    local_77[sVar10] = uVar2;
    local_77[sVar10 + 1] = 0;
    goto switchD_00109a1f_caseD_63;
  }
  switch(bVar1) {
  case 99:
switchD_00109a1f_caseD_63:
    lVar5 = sq_getinteger(pSVar17,lVar12,&local_b0);
    if (lVar5 < 0) {
      pcVar14 = "integer expected for the specified format";
LAB_00109bc1:
      SVar4 = sq_throwerror(pSVar17,pcVar14);
      return SVar4;
    }
    sVar10 = local_a0 + local_a8 + 0x66;
    pSVar6 = (SQChar *)sq_getscratchpad(pSVar17,sVar10);
    auVar11 = (undefined1  [8])local_b0;
    break;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    goto switchD_00109a1f_caseD_64;
  case 0x65:
  case 0x66:
  case 0x67:
    goto switchD_00109a1f_caseD_65;
  default:
switchD_00109a1f_caseD_68:
    pcVar14 = "invalid format";
    goto LAB_00109bc1;
  case 0x73:
    lVar5 = sq_getstring(pSVar17,lVar12,local_80);
    if (lVar5 < 0) {
      pcVar14 = "string expected for the specified format";
      goto LAB_00109bc1;
    }
    lVar5 = sq_getsize(pSVar17,lVar12);
    sVar10 = local_a0 + local_a8 + lVar5 + 2;
    pSVar6 = (SQChar *)sq_getscratchpad(pSVar17,sVar10);
    auVar11 = local_80;
  }
  local_a0 = sVar10;
  iVar3 = snprintf(pSVar6 + lVar15,sVar10,&local_78,auVar11);
LAB_00109b04:
  lVar15 = lVar15 + iVar3;
  lVar16 = lVar13 + 1;
  lVar12 = lVar12 + 1;
  lVar5 = local_38;
LAB_00109b17:
  if (lVar5 <= lVar16) goto LAB_00109b76;
  goto LAB_00109817;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}